

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::TJHexLow
          (AbstractContentContext *this,StringOrDoubleList *inStringsAndSpacing)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  _List_node_base *p_Var2;
  allocator<char> local_41;
  string local_40;
  
  p_Var2 = (inStringsAndSpacing->
           super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  AssertProcsetAvailable(this,&KProcsetText_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::StartArray(this_00);
  for (; p_Var2 != (_List_node_base *)inStringsAndSpacing;
      p_Var2 = (((_List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    if (*(char *)&p_Var2[3]._M_prev == '\x01') {
      PrimitiveObjectsWriter::WriteDouble(this_00,(double)p_Var2[3]._M_next,eTokenSeparatorSpace);
    }
    else {
      PrimitiveObjectsWriter::WriteHexString(this_00,(string *)(p_Var2 + 1),eTokenSeparatorSpace);
    }
  }
  PrimitiveObjectsWriter::EndArray(this_00,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"TJ",&local_41);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::TJHexLow(const StringOrDoubleList& inStringsAndSpacing)
{
	StringOrDoubleList::const_iterator it = inStringsAndSpacing.begin();
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.StartArray();

	for(; it != inStringsAndSpacing.end();++it)
	{
		if(it->IsDouble)
			mPrimitiveWriter.WriteDouble(it->DoubleValue);
		else
			mPrimitiveWriter.WriteHexString(it->SomeValue);
	}
	
	mPrimitiveWriter.EndArray(eTokenSeparatorSpace);

	mPrimitiveWriter.WriteKeyword("TJ");
	return GetCurrentStatusCode();
}